

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

TextureVec *
graphics101::bindable_textures
          (TextureVec *__return_storage_ptr__,TextureSet *textures,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names_in_bind_order)

{
  key_type *pkVar1;
  iterator iVar2;
  mapped_type *__x;
  ostream *poVar3;
  key_type *__k;
  shared_ptr<graphics101::Texture> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<graphics101::Texture>,_std::allocator<std::shared_ptr<graphics101::Texture>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<graphics101::Texture>,_std::allocator<std::shared_ptr<graphics101::Texture>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<graphics101::Texture>,_std::allocator<std::shared_ptr<graphics101::Texture>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<graphics101::Texture>,_std::allocator<std::shared_ptr<graphics101::Texture>_>_>
  ::reserve(__return_storage_ptr__,
            (long)(names_in_bind_order->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(names_in_bind_order->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5);
  pkVar1 = (names_in_bind_order->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__k = (names_in_bind_order->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start; __k != pkVar1; __k = __k + 1) {
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<graphics101::Texture>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<graphics101::Texture>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<graphics101::Texture>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<graphics101::Texture>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)textures,__k);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<graphics101::Texture>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unknown texture name: ",0x16);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(__k->_M_dataplus)._M_p,__k->_M_string_length);
      local_48.super___shared_ptr<graphics101::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT71(local_48.super___shared_ptr<graphics101::Texture,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_48,1);
      local_48.super___shared_ptr<graphics101::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_48.super___shared_ptr<graphics101::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::
      vector<std::shared_ptr<graphics101::Texture>,std::allocator<std::shared_ptr<graphics101::Texture>>>
      ::emplace_back<std::shared_ptr<graphics101::Texture>>
                ((vector<std::shared_ptr<graphics101::Texture>,std::allocator<std::shared_ptr<graphics101::Texture>>>
                  *)__return_storage_ptr__,&local_48);
      if (local_48.super___shared_ptr<graphics101::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<graphics101::Texture,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      __x = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<graphics101::Texture>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<graphics101::Texture>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<graphics101::Texture>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<graphics101::Texture>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)textures,__k);
      std::
      vector<std::shared_ptr<graphics101::Texture>,_std::allocator<std::shared_ptr<graphics101::Texture>_>_>
      ::push_back(__return_storage_ptr__,__x);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TextureVec bindable_textures( TextureSet& textures, const std::vector< std::string >& names_in_bind_order )
{
    TextureVec result;
    result.reserve( names_in_bind_order.size() );
    
    for( const auto& name : names_in_bind_order ) {
        if( textures.find( name ) == textures.end() ) {
            cerr << "Unknown texture name: " << name << '\n';
            result.push_back( nullptr );
            continue;
        }
        
        result.push_back( textures[name] );
    }
    
    return result;
}